

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles3::Functional::getDerivateThreshold
          (Functional *this,Precision precision,Vec4 *valueMin,Vec4 *valueMax,Vec4 *expectedDerivate
          )

{
  int s;
  float *pfVar1;
  int *piVar2;
  float x_;
  float y_;
  float z_;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  ulong uVar4;
  Vec4 VVar5;
  Vector<int,_4> local_e4;
  Vector<unsigned_int,_4> local_d4;
  Vector<int,_4> local_c4;
  Vector<int,_4> local_b4;
  undefined1 local_a4 [8];
  IVec4 numAccurateBits;
  tcu local_84 [8];
  UVec4 numBitsLost;
  Vector<unsigned_int,_4> local_64;
  undefined1 local_54 [8];
  UVec4 maxValueExp;
  UVec4 derivExp;
  int baseBits;
  Vec4 *expectedDerivate_local;
  Vec4 *valueMax_local;
  Vec4 *valueMin_local;
  Precision precision_local;
  
  s = getNumMantissaBits(precision);
  getCompExpBits((Functional *)(maxValueExp.m_data + 2),expectedDerivate);
  getCompExpBits((Functional *)&local_64,valueMin);
  getCompExpBits((Functional *)(numBitsLost.m_data + 2),valueMax);
  tcu::max<unsigned_int,4>
            ((tcu *)local_54,&local_64,(Vector<unsigned_int,_4> *)(numBitsLost.m_data + 2));
  tcu::min<unsigned_int,4>
            ((tcu *)(numAccurateBits.m_data + 2),(Vector<unsigned_int,_4> *)local_54,
             (Vector<unsigned_int,_4> *)(maxValueExp.m_data + 2));
  tcu::operator-(local_84,(Vector<unsigned_int,_4> *)local_54,
                 (Vector<unsigned_int,_4> *)(numAccurateBits.m_data + 2));
  tcu::Vector<unsigned_int,_4>::asInt(&local_d4);
  tcu::operator-((tcu *)&local_c4,s,(Vector<int,_4> *)&local_d4);
  tcu::operator-((tcu *)&local_b4,&local_c4,3);
  tcu::Vector<int,_4>::Vector(&local_e4,0);
  tcu::max<int,4>((tcu *)local_a4,&local_b4,&local_e4);
  pfVar1 = tcu::Vector<float,_4>::operator[](expectedDerivate,0);
  fVar3 = *pfVar1;
  piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a4,0);
  x_ = computeFloatingPointError(fVar3,*piVar2);
  pfVar1 = tcu::Vector<float,_4>::operator[](expectedDerivate,1);
  fVar3 = *pfVar1;
  piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a4,1);
  y_ = computeFloatingPointError(fVar3,*piVar2);
  pfVar1 = tcu::Vector<float,_4>::operator[](expectedDerivate,2);
  fVar3 = *pfVar1;
  piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a4,2);
  z_ = computeFloatingPointError(fVar3,*piVar2);
  pfVar1 = tcu::Vector<float,_4>::operator[](expectedDerivate,3);
  fVar3 = *pfVar1;
  piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_a4,3);
  fVar3 = computeFloatingPointError(fVar3,*piVar2);
  uVar4 = (ulong)(uint)y_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,fVar3);
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)(uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

static inline tcu::Vec4 getDerivateThreshold (const glu::Precision precision, const tcu::Vec4& valueMin, const tcu::Vec4& valueMax, const tcu::Vec4& expectedDerivate)
{
	const int			baseBits		= getNumMantissaBits(precision);
	const tcu::UVec4	derivExp		= getCompExpBits(expectedDerivate);
	const tcu::UVec4	maxValueExp		= max(getCompExpBits(valueMin), getCompExpBits(valueMax));
	const tcu::UVec4	numBitsLost		= maxValueExp - min(maxValueExp, derivExp);
	const tcu::IVec4	numAccurateBits	= max(baseBits - numBitsLost.asInt() - (int)INTERPOLATION_LOST_BITS, tcu::IVec4(0));

	return tcu::Vec4(computeFloatingPointError(expectedDerivate[0], numAccurateBits[0]),
					 computeFloatingPointError(expectedDerivate[1], numAccurateBits[1]),
					 computeFloatingPointError(expectedDerivate[2], numAccurateBits[2]),
					 computeFloatingPointError(expectedDerivate[3], numAccurateBits[3]));
}